

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O2

void BM_chebyshev(State *state)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  long lVar5;
  allocator local_51;
  key_type local_50;
  
  if (state[0x1a] == (State)0x0) {
    lVar5 = *(long *)(state + 0x10);
  }
  else {
    lVar5 = 0;
  }
  benchmark::State::StartKeepRunning(state);
  lVar5 = lVar5 + 1;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      benchmark::State::FinishKeepRunning(state);
      goto LAB_00119d53;
    }
    bVar1 = isprime_chebyshev(**(uint64_t **)(state + 0x20));
    iVar2 = gaIIsPrime(**(uint64_t **)(state + 0x20));
    std::__cxx11::string::string((string *)&local_50,"IS PRIME",&local_51);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
                           *)(state + 0x40),&local_50);
    pmVar3->value = (double)bVar1;
    pmVar3->flags = kDefaults;
    pmVar3->oneK = kIs1000;
    std::__cxx11::string::~string((string *)&local_50);
  } while (bVar1 != (iVar2 == 0));
  poVar4 = std::operator<<((ostream *)std::cout,"Sanity check failed for ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4,"\n");
LAB_00119d53:
  *(undefined8 *)(state + 0x38) = **(undefined8 **)(state + 0x20);
  return;
}

Assistant:

static void BM_chebyshev(benchmark::State& state) {

  for (auto _ : state) {
    bool prime = isprime_chebyshev(state.range(0));
    bool sanity_test = gaIIsPrime(state.range(0));
    state.counters["IS PRIME"] = prime; 
    if (sanity_test != prime) {
        std::cout << "Sanity check failed for " << state.range(0) << "\n";
        break;
    }
  }
  state.SetComplexityN(state.range(0));
}